

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::detail::decomp_assert(Enum at,char *file,int line,char *expr,Result *result)

{
  bool bVar1;
  code *pcVar2;
  char extraout_AL;
  undefined1 uVar3;
  bool bVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  ResultBuilder rb;
  String local_d8;
  AssertData local_c0;
  
  bVar1 = result->m_passed;
  local_c0.m_failed = (bool)(bVar1 ^ 1);
  if (is_running_in_test == '\0') {
    if (bVar1 != false) {
      return bVar1;
    }
    String::String(&local_d8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_d8);
    String::~String(&local_d8);
    String::operator=(&local_c0.m_decomp,&result->m_decomp);
    failed_out_of_a_testing_context(&local_c0);
    bVar4 = isDebuggerActive();
    if ((bVar4) && (*(char *)(g_cs + 0x79) == '\0')) {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    bVar4 = checkIfShouldThrow(at);
    if (bVar4) {
      throwException();
    }
  }
  else {
    String::String(&local_d8,"");
    ResultBuilder::ResultBuilder((ResultBuilder *)&local_c0,at,file,line,expr,"",&local_d8);
    String::~String(&local_d8);
    if ((bVar1 == false) || (__x = extraout_XMM0_Qa, *(char *)(g_cs + 0x6c) == '\x01')) {
      String::operator=(&local_c0.m_decomp,&result->m_decomp);
      __x = extraout_XMM0_Qa_00;
    }
    ResultBuilder::log((ResultBuilder *)&local_c0,__x);
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    if ((local_c0.m_failed == true) && (bVar4 = checkIfShouldThrow(at), bVar4)) {
      throwException();
    }
  }
  AssertData::~AssertData(&local_c0);
  return bVar1;
}

Assistant:

bool decomp_assert(assertType::Enum at, const char* file, int line, const char* expr,
                       const Result& result) {
        bool failed = !result.m_passed;

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(result.m_decomp);
        DOCTEST_ASSERT_IN_TESTS(result.m_decomp);
        return !failed;
    }